

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-schema-to-grammar.cpp
# Opt level: O0

string * build_repetition(string *item_rule,int min_items,int max_items,string *separator_rule)

{
  int iVar1;
  ulong uVar2;
  int in_ECX;
  int in_EDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  undefined8 in_R8;
  byte bVar3;
  bool has_max;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffda0;
  allocator<char> *__rhs;
  undefined4 in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdac;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined4 in_stack_fffffffffffffdd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde8;
  int in_stack_fffffffffffffdec;
  string local_208 [39];
  allocator<char> local_1e1;
  string local_1e0 [32];
  string local_1c0 [32];
  string local_1a0 [32];
  string local_180 [32];
  string local_160 [32];
  string local_140 [32];
  string local_120 [37];
  undefined1 local_fb;
  byte local_fa;
  allocator<char> local_f9;
  string local_f8 [48];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  string local_48 [32];
  undefined7 in_stack_ffffffffffffffd8;
  int iVar4;
  
  __lhs = in_RDI;
  iVar4 = in_ECX;
  iVar1 = std::numeric_limits<int>::max();
  bVar3 = in_ECX != iVar1;
  if ((in_EDX == 0) && (iVar4 == 1)) {
    std::operator+(__lhs,(char *)in_RDI);
  }
  else {
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      local_fb = 0;
      std::operator+(__lhs,(char *)in_RDI);
      std::operator+((char *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                     in_stack_fffffffffffffde0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                     (char *)in_stack_fffffffffffffda0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                     in_stack_fffffffffffffda0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                     (char *)in_stack_fffffffffffffda0);
      iVar1 = iVar4;
      if ((bVar3 & 1) != 0) {
        iVar1 = iVar4 + -1;
      }
      __rhs = &local_1e1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffde0,(char *)in_stack_fffffffffffffdd8,
                 (allocator<char> *)CONCAT44(in_ECX,in_stack_fffffffffffffdd0));
      build_repetition((string *)CONCAT44(in_EDX,iVar4),(int)((ulong)in_R8 >> 0x20),(int)in_R8,
                       (string *)CONCAT17(bVar3,in_stack_ffffffffffffffd8));
      std::operator+(in_stack_fffffffffffffdd8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_ECX,in_stack_fffffffffffffdd0));
      std::__cxx11::string::~string(local_140);
      std::__cxx11::string::~string(local_1e0);
      std::allocator<char>::~allocator(&local_1e1);
      std::__cxx11::string::~string(local_160);
      std::__cxx11::string::~string(local_180);
      std::__cxx11::string::~string(local_1a0);
      std::__cxx11::string::~string(local_1c0);
      std::__cxx11::string::~string(local_120);
      if (in_EDX == 0) {
        std::operator+((char *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                       in_stack_fffffffffffffde0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(iVar1,in_stack_fffffffffffffda8),(char *)__rhs);
        std::__cxx11::string::operator=((string *)in_RDI,local_208);
        std::__cxx11::string::~string(local_208);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffdd8);
      }
    }
    else if ((in_EDX == 1) && ((bVar3 & 1) == 0)) {
      std::operator+(__lhs,(char *)in_RDI);
    }
    else if ((in_EDX == 0) && ((bVar3 & 1) == 0)) {
      std::operator+(__lhs,(char *)in_RDI);
    }
    else {
      std::operator+(__lhs,(char *)in_RDI);
      std::__cxx11::to_string(in_stack_fffffffffffffdec);
      std::operator+(in_stack_fffffffffffffdd8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_ECX,in_stack_fffffffffffffdd0));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                     (char *)in_stack_fffffffffffffda0);
      local_fa = 0;
      if ((bVar3 & 1) == 0) {
        std::allocator<char>::allocator();
        local_fa = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffde0,(char *)in_stack_fffffffffffffdd8,
                   (allocator<char> *)CONCAT44(in_ECX,in_stack_fffffffffffffdd0));
      }
      else {
        std::__cxx11::to_string(in_stack_fffffffffffffdec);
      }
      std::operator+(in_stack_fffffffffffffdd8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_ECX,in_stack_fffffffffffffdd0));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                     (char *)in_stack_fffffffffffffda0);
      std::__cxx11::string::~string(local_48);
      std::__cxx11::string::~string(local_f8);
      if ((local_fa & 1) != 0) {
        std::allocator<char>::~allocator(&local_f9);
      }
      std::__cxx11::string::~string(local_68);
      std::__cxx11::string::~string(local_88);
      std::__cxx11::string::~string(local_c8);
      std::__cxx11::string::~string(local_a8);
    }
  }
  return __lhs;
}

Assistant:

static std::string build_repetition(const std::string & item_rule, int min_items, int max_items, const std::string & separator_rule = "") {
    auto has_max = max_items != std::numeric_limits<int>::max();

    if (min_items == 0 && max_items == 1) {
        return item_rule + "?";
    }

    if (separator_rule.empty()) {
        if (min_items == 1 && !has_max) {
            return item_rule + "+";
        } else if (min_items == 0 && !has_max) {
            return item_rule + "*";
        } else {
            return item_rule + "{" + std::to_string(min_items) + "," + (has_max ? std::to_string(max_items) : "") + "}";
        }
    }

    auto result = item_rule + " " + build_repetition("(" + separator_rule + " " + item_rule + ")", min_items == 0 ? 0 : min_items - 1, has_max ? max_items - 1 : max_items);
    if (min_items == 0) {
        result = "(" + result + ")?";
    }
    return result;
}